

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O3

int __thiscall MNS::Request::Parse(Request *this,ssize_t requestLen)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  uint uVar8;
  HTTP_VERSION HVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  char *pcVar13;
  key_type local_50;
  
  if (requestLen < 0) {
    uVar4 = this->lastParsePos;
    requestLen = this->bufferLen;
  }
  else {
    this->finished = false;
    this->lastParsePos = 0;
    uVar4 = 0;
    this->bufferLen = requestLen;
  }
  lVar10 = (long)(int)uVar4;
  this->state = PARSING_HEADERS;
  if (lVar10 < requestLen) {
    uVar8 = 0;
    do {
      uVar3 = (uint)uVar4;
      if (4 < uVar8) {
        uVar3 = (uint)requestLen;
        this->finished = true;
        goto switchD_00108735_caseD_45;
      }
      pcVar13 = this->buffer;
      bVar11 = pcVar13[lVar10];
      pcVar1 = pcVar13 + lVar10;
      switch(uVar8) {
      case 0:
        uVar8 = 1;
        switch(bVar11 & 0xdf) {
        case 0x43:
          this->method = CONNECT;
          goto LAB_00108903;
        case 0x44:
          this->method = DELETE;
          uVar3 = uVar3 + 6;
          break;
        case 0x45:
        case 0x46:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4c:
        case 0x4d:
        case 0x4e:
          break;
        case 0x47:
          this->method = GET;
          goto LAB_00108995;
        case 0x48:
          this->method = HEAD;
LAB_00108971:
          uVar3 = uVar3 + 4;
          break;
        case 0x4f:
          this->method = OPTIONS;
LAB_00108903:
          uVar3 = uVar3 + 7;
          break;
        case 0x50:
          if ((pcVar1[1] & 0xdfU) != 0x55) {
            if ((pcVar1[1] & 0xdfU) != 0x4f) {
              this->method = PATCH;
              goto LAB_001089a1;
            }
            this->method = POST;
            goto LAB_00108971;
          }
          this->method = PUT;
LAB_00108995:
          uVar3 = uVar3 + 3;
          break;
        default:
          if ((bVar11 & 0xdf) == 0x54) {
            this->method = TRACE;
LAB_001089a1:
            uVar3 = uVar3 + 5;
          }
        }
        break;
      case 1:
        this->url = pcVar1;
        pvVar5 = memchr(pcVar1,0x20,requestLen - lVar10);
        if (pvVar5 == (void *)0x0) {
LAB_001089a9:
          this->state = NEED_MORE_DATA;
          return 1;
        }
        uVar3 = (int)pvVar5 - (int)pcVar13;
        uVar8 = 2;
        pcVar13[(int)uVar3] = '\0';
        goto LAB_00108903;
      case 2:
        if (bVar11 == 0x31) {
          HVar9 = HTTP_1_1;
LAB_00108915:
          this->httpVersion = HVar9;
        }
        else if (bVar11 == 0x30) {
          HVar9 = HTTP_1_0;
          goto LAB_00108915;
        }
        uVar3 = uVar3 + 2;
        uVar8 = 3;
        break;
      case 3:
        if (bVar11 != 0x3a) {
          lVar10 = (long)(int)uVar3;
          do {
            if ('@' < (char)bVar11) {
              pcVar13[lVar10] = pcVar13[lVar10] | 0x20;
              pcVar13 = this->buffer;
            }
            bVar11 = pcVar13[lVar10 + 1];
            lVar10 = lVar10 + 1;
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while (bVar11 != 0x3a);
        }
        pcVar13[(int)uVar3] = '\0';
        pcVar2 = this->buffer;
        lVar10 = (long)(int)((pcVar2[(long)(int)uVar3 + 1] == ' ') + 1 + uVar3);
        pcVar13 = pcVar2 + lVar10;
        pvVar5 = memchr(pcVar13,0xd,this->bufferLen - lVar10);
        if (pvVar5 == (void *)0x0) goto LAB_001089a9;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        iVar12 = (int)((long)pvVar5 - (long)pcVar2);
        pcVar2[iVar12] = '\0';
        sVar6 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,pcVar1 + sVar6);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->headers,&local_50);
        pcVar1 = (char *)pmVar7->_M_string_length;
        strlen(pcVar13);
        std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar1,(ulong)pcVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar3 = iVar12 + 1;
        lVar10 = (long)pvVar5 - (long)pcVar2 << 0x20;
        uVar8 = 3;
        if ((this->buffer[lVar10 + 0x200000000 >> 0x20] == '\r') &&
           (this->buffer[lVar10 + 0x300000000 >> 0x20] == '\n')) {
          lVar10 = lVar10 + 0x400000000 >> 0x20;
          if ((this->method & ~OPTIONS) == GET) {
            if (lVar10 < this->bufferLen) {
              this->lastParsePos = lVar10;
              return 0;
            }
LAB_001089c2:
            this->finished = true;
            return 0;
          }
          uVar8 = 4;
          if (this->bufferLen <= lVar10) goto LAB_001089c2;
        }
        break;
      case 4:
        lVar10 = (long)(int)uVar3;
        uVar3 = uVar3 + 2;
        uVar8 = 5;
        this->bodyBuffer = pcVar13 + lVar10 + 2;
        this->bodyBufferLen = requestLen - (lVar10 + 2);
      }
switchD_00108735_caseD_45:
      requestLen = this->bufferLen;
      uVar4 = (ulong)(uVar3 + 1);
      lVar10 = (long)(int)(uVar3 + 1);
    } while (lVar10 < requestLen);
  }
  return 0;
}

Assistant:

int MNS::Request::Parse(ssize_t requestLen) {
	if(requestLen >= 0) {
		this->finished = false;
		this->lastParsePos = 0;
		this->bufferLen = requestLen;
	}

	char *tailPos = NULL;
	this->state = REQUEST_STATE::PARSING_HEADERS;
	
	PARSER_STATE parserState = PARSER_STATE::METHOD;

	for (int i = this->lastParsePos; i < this->bufferLen; i++) {
		char c = this->buffer[i];

		switch (parserState) {
			case PARSER_STATE::METHOD:
				if (c == 'G' || c == 'g') {
					this->method = HTTP_METHOD::GET;
					i += 3;
				} else if (c == 'O' || c == 'o') {
					this->method = HTTP_METHOD::OPTIONS;
					i += 7;
				} else if (c == 'P' || c == 'p') {
					char c1 = this->buffer[i + 1];
					if (c1 == 'O' || c1 == 'o') {
						this->method = HTTP_METHOD::POST;
						i += 4;
					} else if (c1 == 'U' || c1 == 'u') {
						this->method = HTTP_METHOD::PUT;
						i += 3;
					} else {
						this->method = HTTP_METHOD::PATCH;
						i += 5;
						// Todo: This may be unsafe and offset should be found
					}
				} else if (c == 'H' || c == 'h') {
					this->method = HTTP_METHOD::HEAD;
					i += 4;
				} else if (c == 'D' || c == 'd') {
					this->method = HTTP_METHOD::DELETE;
					i += 6;
				} else if (c == 'C' || c == 'c') {
					this->method = HTTP_METHOD::CONNECT;
					i += 7;
				} else if (c == 'T' || c == 't') {
					this->method = HTTP_METHOD::TRACE;
					i += 5;
				}

				parserState = PARSER_STATE::URL;
				break;
			case PARSER_STATE::URL:
				this->url = this->buffer + i;
				tailPos = (char*)memchr(this->url, ' ', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MROE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				}
				i = (int)(tailPos - this->buffer);
				buffer[i] = '\0';

				i += 7;
				parserState = PARSER_STATE::HTTP_VERSION;
				break;
			case PARSER_STATE::HTTP_VERSION:
				if (c == '1') this->httpVersion = HTTP_VERSION::HTTP_1_1;
				else if (c == '0') this->httpVersion = HTTP_VERSION::HTTP_1_0;
				parserState = PARSER_STATE::HEADER_NAME;
				i += 2;
				break;
			case PARSER_STATE::HEADER_NAME: {
				char *name = buffer + i;
				while (c != ':') {
					if (c >= 'A') buffer[i] |= 0x20;//-= 'A' - 'a';

					c = buffer[++i];
				}

				buffer[i] = '\0';
				i += (buffer[i + 1] == ' '?2:1);

				char *value = buffer + i;
				tailPos = (char *)memchr(buffer+i, '\r', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MORE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				} else {
					i = (int) (tailPos - buffer);
					buffer[i++] = '\0';
				}

				//this->headers[std::string(name, nameLen)] = std::string(value, valueLen);
				this->headers[name] = value;

				// Finished parsing headers
				if (buffer[i + 1] == '\r' && buffer[i + 2] == '\n') {
					// Possibility of pipelining
					if(this->method == HTTP_METHOD::GET || this->method == HTTP_METHOD::HEAD) {
						// More pipelined requests
						if(i + 3 < this->bufferLen) {
							this->lastParsePos = i+3;

							// Return back to handler
							return 0;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					} else {
						// Is request not drained
						if(i + 3 < this->bufferLen) {
							parserState = PARSER_STATE::BODY;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					}
				}

				break;
			}
			case PARSER_STATE::BODY:
				i += 2;
				// TODO: Copy the body into the message buffer to send to onData event
				this->bodyBuffer = buffer + i;
				this->bodyBufferLen = this->bufferLen - i;
				parserState = PARSER_STATE::FINISHED;
				break;
			default:
				i = this->bufferLen;
				this->finished = true;
				break;
		}
	}

	return 0;
}